

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

iterator __thiscall Json::Value::end(Value *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  long *in_RSI;
  iterator in_RDI;
  iterator iVar2;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffffc8;
  iterator this_00;
  
  if (((char)in_RSI[1] == '\x06' || (char)in_RSI[1] == '\a') && (*in_RSI != 0)) {
    this_00._M_node = in_RDI._M_node;
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::end(in_stack_ffffffffffffffc8);
    ValueIterator::ValueIterator
              ((ValueIterator *)this_00._M_node,(iterator *)in_stack_ffffffffffffffc8);
    uVar1 = extraout_RDX;
  }
  else {
    ValueIterator::ValueIterator((ValueIterator *)0x1606bf);
    uVar1 = extraout_RDX_00;
  }
  iVar2.super_ValueIteratorBase._8_8_ = uVar1;
  iVar2.super_ValueIteratorBase.current_._M_node = in_RDI._M_node;
  return (iterator)iVar2.super_ValueIteratorBase;
}

Assistant:

Value::iterator Value::end() {
  switch (type_) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return iterator(value_.map_->end());
    break;
  default:
    break;
  }
  return iterator();
}